

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceDynamicProfileManager.cpp
# Opt level: O2

SourceDynamicProfileManager *
Js::SourceDynamicProfileManager::LoadFromDynamicProfileStorage
          (SourceContextInfo *info,ScriptContext *scriptContext,
          SimpleDataCacheWrapper *dataCacheWrapper)

{
  Recycler *recycler;
  Type pcVar1;
  code *pcVar2;
  bool bVar3;
  DWORD DVar4;
  undefined4 *puVar5;
  char *buffer;
  char16 *pcVar6;
  Recycler *alloc;
  SourceDynamicProfileManager *pSVar7;
  undefined1 local_68 [8];
  TrackAllocData data;
  AutoCriticalSection autocs;
  Type local_30;
  
  recycler = scriptContext->recycler;
  if ((!DynamicProfileStorage::enabled) ||
     (pcVar1 = (info->field_5).field_0.url, pcVar1 == (Type)0x0)) goto LAB_009e43e5;
  data._32_8_ = &DynamicProfileStorage::cs;
  local_30 = pcVar1;
  CCLock::Enter(&DynamicProfileStorage::cs.super_CCLock);
  if ((DynamicProfileStorage::useCacheDir == true) &&
     (bVar3 = DynamicProfileStorage::AcquireLock(), bVar3)) {
    DynamicProfileStorage::LoadCacheCatalog();
  }
  bVar3 = JsUtil::
          BaseDictionary<char16_t_const*,DynamicProfileStorage::StorageInfo,Memory::NoCheckHeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::DictionaryEntry,JsUtil::NoResizeLock>
          ::TryGetReference<char16_t_const*>
                    ((BaseDictionary<char16_t_const*,DynamicProfileStorage::StorageInfo,Memory::NoCheckHeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::DictionaryEntry,JsUtil::NoResizeLock>
                      *)&DynamicProfileStorage::infoMap,&local_30,(StorageInfo **)&autocs);
  if (bVar3) {
    if (((autocs.cs)->super_CCLock).mutexPtr[0] == '\x01') {
      if (DynamicProfileStorage::useCacheDir == false) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar5 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/DynamicProfileStorage.h"
                                    ,0x74,"(useCacheDir)","useCacheDir");
        if (!bVar3) goto LAB_009e444b;
        *puVar5 = 0;
      }
      if (DynamicProfileStorage::locked == false) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar5 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/DynamicProfileStorage.h"
                                    ,0x75,"(locked)","locked");
        if (!bVar3) goto LAB_009e444b;
        *puVar5 = 0;
      }
      buffer = DynamicProfileStorage::StorageInfo::ReadRecord((StorageInfo *)autocs.cs);
      DynamicProfileStorage::ReleaseLock();
      if (buffer == (char *)0x0) {
        bVar3 = DynamicProfileStorage::DoTrace();
        if (bVar3) {
          Output::Print(L"TRACE: DynamicProfileStorage: Failed to load from cache dir for \'%s\'",
                        local_30);
          Output::Flush();
        }
        goto LAB_009e43d4;
      }
    }
    else {
      buffer = *(char **)(((autocs.cs)->super_CCLock).mutexPtr + 8);
    }
    DVar4 = DynamicProfileStorage::GetRecordSize(buffer);
    if (DVar4 == 0) goto LAB_009e43d4;
    local_68 = (undefined1  [8])DynamicProfileStorage::GetRecordBuffer(buffer);
    data.typeinfo = (type_info *)(ulong)DVar4;
    pSVar7 = Deserialize<Js::BufferReader>((BufferReader *)local_68,recycler);
    if (((autocs.cs)->super_CCLock).mutexPtr[0] == '\x01') {
      if (DynamicProfileStorage::useCacheDir == false) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar5 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/DynamicProfileStorage.h"
                                    ,0x91,"(useCacheDir)","useCacheDir");
        if (!bVar3) goto LAB_009e444b;
        *puVar5 = 0;
      }
      DynamicProfileStorage::DeleteRecord(buffer);
    }
    bVar3 = DynamicProfileStorage::DoTrace();
    if (bVar3 && pSVar7 != (SourceDynamicProfileManager *)0x0) {
      Output::Print(L"TRACE: DynamicProfileStorage: Dynamic Profile Data Loaded: \'%s\'\n",local_30)
      ;
    }
    else if (pSVar7 == (SourceDynamicProfileManager *)0x0) {
      pcVar6 = DynamicProfileStorage::GetMessageType();
      if (pcVar6 != (char16 *)0x0) {
        Output::Print(L"%s: DynamicProfileStorage: Dynamic Profile Data corrupted: \'%s\'\n",pcVar6,
                      local_30);
        Output::Flush();
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar5 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/DynamicProfileStorage.h"
                                    ,0xa2,"(false)","false");
        if (!bVar3) {
LAB_009e444b:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar5 = 0;
      }
      goto LAB_009e43d4;
    }
  }
  else {
    if (DynamicProfileStorage::useCacheDir == true) {
      DynamicProfileStorage::ReleaseLock();
    }
LAB_009e43d4:
    pSVar7 = (SourceDynamicProfileManager *)0x0;
  }
  AutoCriticalSection::~AutoCriticalSection((AutoCriticalSection *)&data.line);
  if (pSVar7 != (SourceDynamicProfileManager *)0x0) {
    return pSVar7;
  }
LAB_009e43e5:
  local_68 = (undefined1  [8])&typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_57ade96;
  data.filename._0_4_ = 0x116;
  alloc = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_68);
  pSVar7 = (SourceDynamicProfileManager *)new<Memory::Recycler>(0x98,alloc,0x37a1d4);
  SourceDynamicProfileManager(pSVar7,recycler);
  return pSVar7;
}

Assistant:

SourceDynamicProfileManager *
    SourceDynamicProfileManager::LoadFromDynamicProfileStorage(SourceContextInfo* info, ScriptContext* scriptContext, SimpleDataCacheWrapper* dataCacheWrapper)
    {
        SourceDynamicProfileManager* manager = nullptr;
        Recycler* recycler = scriptContext->GetRecycler();

#ifdef DYNAMIC_PROFILE_STORAGE
        if(DynamicProfileStorage::IsEnabled() && info->url != nullptr)
        {
            manager = DynamicProfileStorage::Load(info->url, [recycler](char const * buffer, uint length) -> SourceDynamicProfileManager *
            {
                BufferReader reader(buffer, length);
                return SourceDynamicProfileManager::Deserialize(&reader, recycler);
            });
        }
#endif
        if(manager == nullptr)
        {
            manager = RecyclerNew(recycler, SourceDynamicProfileManager, recycler);
        }
        if(dataCacheWrapper != nullptr)
        {
            bool profileLoaded = manager->LoadFromProfileCache(dataCacheWrapper, info->url);
            if(profileLoaded)
            {
                JS_ETW(EventWriteJSCRIPT_PROFILE_LOAD(info->dwHostSourceContext, scriptContext));
            }
        }
        return manager;
    }